

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O0

void Omega_h::transfer_common2<int>
               (Mesh *old_mesh,Mesh *new_mesh,Int ent_dim,LOs *same_ents2old_ents,
               LOs *same_ents2new_ents,TagBase *tagbase,Write<int> *new_data)

{
  Int width;
  Write<int> local_e8;
  Write<int> local_d8;
  Read<int> local_c8;
  Read<int> local_b8;
  Read<int> local_a8 [2];
  Read<int> local_88;
  Write<int> local_78;
  undefined1 local_68 [8];
  Read<int> same_data;
  Read<int> old_data;
  Int ncomps;
  string *name;
  TagBase *tagbase_local;
  LOs *same_ents2new_ents_local;
  LOs *same_ents2old_ents_local;
  Int ent_dim_local;
  Mesh *new_mesh_local;
  Mesh *old_mesh_local;
  
  TagBase::name_abi_cxx11_(tagbase);
  width = TagBase::ncomps(tagbase);
  Mesh::get_array<int>
            ((Mesh *)&same_data.write_.shared_alloc_.direct_ptr,(Int)old_mesh,
             (string *)(ulong)(uint)ent_dim);
  Read<int>::Read(&local_88,same_ents2old_ents);
  Read<int>::Read(local_a8,(Read<int> *)&same_data.write_.shared_alloc_.direct_ptr);
  unmap<int>((Omega_h *)&local_78,&local_88,local_a8,width);
  read<int>((Omega_h *)local_68,&local_78);
  Write<int>::~Write(&local_78);
  Read<int>::~Read(local_a8);
  Read<int>::~Read(&local_88);
  Read<int>::Read(&local_b8,(Read<int> *)local_68);
  Read<int>::Read(&local_c8,same_ents2new_ents);
  Write<int>::Write(&local_d8,new_data);
  map_into<int>(&local_b8,&local_c8,&local_d8,width);
  Write<int>::~Write(&local_d8);
  Read<int>::~Read(&local_c8);
  Read<int>::~Read(&local_b8);
  Write<int>::Write(&local_e8,new_data);
  transfer_common3<int>(new_mesh,ent_dim,tagbase,&local_e8);
  Write<int>::~Write(&local_e8);
  Read<int>::~Read((Read<int> *)local_68);
  Read<int>::~Read((Read<int> *)&same_data.write_.shared_alloc_.direct_ptr);
  return;
}

Assistant:

void transfer_common2(Mesh* old_mesh, Mesh* new_mesh, Int ent_dim,
    LOs same_ents2old_ents, LOs same_ents2new_ents, TagBase const* tagbase,
    Write<T> new_data) {
  auto const& name = tagbase->name();
  auto ncomps = tagbase->ncomps();
  auto old_data = old_mesh->get_array<T>(ent_dim, name);
  auto same_data = read(unmap(same_ents2old_ents, old_data, ncomps));
  map_into(same_data, same_ents2new_ents, new_data, ncomps);
  transfer_common3(new_mesh, ent_dim, tagbase, new_data);
}